

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::resetAll
          (SeparatedSyntaxList<slang::syntax::SyntaxNode> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_78;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_68;
  
  local_78.size_ = children.size_;
  local_78.data_ = children.data_;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector(&local_68,local_78.size_);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::
  append<nonstd::span_lite::span<slang::syntax::TokenOrSyntax_const,18446744073709551615ul>>
            (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,&local_78);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)alloc,src);
  (this->elements).data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (this->elements).size_ = extraout_RDX;
  (this->super_SyntaxListBase).childCount =
       local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }